

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,duckdb::hugeint_t,duckdb::UnaryOperatorWrapper,duckdb::MD5Number128Operator>
               (string_t *ldata,hugeint_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  TemplatedValidityData<unsigned_long> *pTVar4;
  ulong uVar5;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int64_t iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  unsigned_long uVar12;
  ulong uVar13;
  string_t input;
  string_t input_00;
  string_t input_01;
  hugeint_t hVar14;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar7 = 8;
      iVar11 = count;
      do {
        input.value.pointer.ptr = (char *)count;
        input.value._0_8_ = *(undefined8 *)((long)&ldata->value + lVar7);
        hVar14 = MD5Number128Operator::Operation<duckdb::string_t,duckdb::hugeint_t>
                           (*(MD5Number128Operator **)((long)ldata + lVar7 + -8),input);
        count = hVar14.upper;
        *(uint64_t *)((long)result_data + lVar7 + -8) = hVar14.lower;
        *(idx_t *)((long)&result_data->lower + lVar7) = count;
        lVar7 = lVar7 + 0x10;
        iVar11 = iVar11 - 1;
      } while (iVar11 != 0);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var3 = p_Stack_40;
      peVar2 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar4 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar4->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      iVar6 = extraout_RDX;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
      iVar6 = extraout_RDX_00;
    }
    if (0x3f < count + 0x3f) {
      uVar5 = 0;
      uVar10 = 0;
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar12 = 0xffffffffffffffff;
        }
        else {
          uVar12 = puVar1[uVar5];
        }
        uVar8 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar8 = count;
        }
        uVar9 = uVar8;
        if (uVar12 != 0) {
          uVar9 = uVar10;
          if (uVar12 == 0xffffffffffffffff) {
            if (uVar10 < uVar8) {
              uVar13 = uVar10 << 4 | 8;
              do {
                input_00.value.pointer.ptr = (char *)iVar6;
                input_00.value._0_8_ = *(undefined8 *)((long)&ldata->value + uVar13);
                hVar14 = MD5Number128Operator::Operation<duckdb::string_t,duckdb::hugeint_t>
                                   (*(MD5Number128Operator **)((long)ldata + (uVar13 - 8)),input_00)
                ;
                iVar6 = hVar14.upper;
                *(uint64_t *)((long)result_data + (uVar13 - 8)) = hVar14.lower;
                *(int64_t *)((long)&result_data->lower + uVar13) = iVar6;
                uVar10 = uVar10 + 1;
                uVar13 = uVar13 + 0x10;
                uVar9 = uVar10;
              } while (uVar8 != uVar10);
            }
          }
          else if (uVar10 < uVar8) {
            uVar9 = uVar10 << 4 | 8;
            uVar13 = 0;
            do {
              if ((uVar12 >> (uVar13 & 0x3f) & 1) != 0) {
                input_01.value.pointer.ptr = (char *)iVar6;
                input_01.value._0_8_ = *(undefined8 *)((long)&ldata->value + uVar9);
                hVar14 = MD5Number128Operator::Operation<duckdb::string_t,duckdb::hugeint_t>
                                   (*(MD5Number128Operator **)((long)ldata + (uVar9 - 8)),input_01);
                iVar6 = hVar14.upper;
                *(uint64_t *)((long)result_data + (uVar9 - 8)) = hVar14.lower;
                *(int64_t *)((long)&result_data->lower + uVar9) = iVar6;
              }
              uVar13 = uVar13 + 1;
              uVar9 = uVar9 + 0x10;
            } while ((uVar10 - uVar8) + uVar13 != 0);
            uVar9 = uVar10 + uVar13;
          }
        }
        uVar5 = uVar5 + 1;
        uVar10 = uVar9;
      } while (uVar5 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}